

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extract.cpp
# Opt level: O0

int cli::extract(Parser *parse,Option *options)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  _Ios_Openmode _Var4;
  ostream *poVar5;
  char *pcVar6;
  Option *pOVar7;
  reference ppEVar8;
  bool local_369;
  bool extractSuccess;
  size_t size;
  char *data;
  fstream stream;
  char local_348 [512];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [8];
  string fullpath;
  Entry *entry;
  iterator __end2;
  iterator __begin2;
  EntryList *__range2;
  EntryList list;
  undefined1 local_c8 [8];
  string outPath;
  undefined1 local_a0 [8];
  Archive archive;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string path;
  Option *options_local;
  Parser *parse_local;
  
  path.field_2._8_8_ = options;
  iVar3 = option::Parser::nonOptionsCount(parse);
  if (iVar3 < 1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Filename required");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    return 1;
  }
  pcVar6 = option::Parser::nonOption(parse,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,pcVar6,&local_41);
  std::allocator<char>::~allocator(&local_41);
  ZAP::Archive::Archive((Archive *)local_a0);
  bVar1 = ZAP::Archive::openFile((Archive *)local_a0,(string *)local_40);
  if (bVar1) {
    pOVar7 = option::Option::operator_cast_to_Option_((Option *)(path.field_2._8_8_ + 0x60));
    if (pOVar7 == (Option *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_c8,".",
                 (allocator<char> *)
                 ((long)&list.
                         super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&list.
                         super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      iVar3 = option::Parser::nonOptionsCount(parse);
      if (1 < iVar3) {
        pcVar6 = option::Parser::nonOption(parse,1);
        std::__cxx11::string::operator=((string *)local_c8,pcVar6);
      }
      bVar1 = isDirectory((string *)local_c8);
      if (bVar1) {
        std::vector<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>::
        vector((vector<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_> *)
               &__range2);
        ZAP::Archive::getFileList
                  ((Archive *)local_a0,
                   (vector<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
                    *)&__range2);
        __end2 = std::
                 vector<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>::
                 begin((vector<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
                        *)&__range2);
        entry = (Entry *)std::
                         vector<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
                         ::end((vector<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
                                *)&__range2);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<const_ZAP::Archive::Entry_**,_std::vector<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>_>
                                           *)&entry), bVar1) {
          ppEVar8 = __gnu_cxx::
                    __normal_iterator<const_ZAP::Archive::Entry_**,_std::vector<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>_>
                    ::operator*(&__end2);
          fullpath.field_2._8_8_ = *ppEVar8;
          std::operator+(&local_148,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c8,'/');
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_128,&local_148,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         fullpath.field_2._8_8_);
          std::__cxx11::string::~string((string *)&local_148);
          cleanPath((string *)local_128);
          bVar1 = createPath((string *)local_128);
          if (bVar1) {
            pcVar6 = (char *)std::__cxx11::string::c_str();
            _Var4 = std::operator|(_S_out,_S_bin);
            _Var4 = std::operator|(_Var4,_S_trunc);
            std::fstream::fstream(&data,pcVar6,_Var4);
            bVar2 = std::fstream::is_open();
            if ((bVar2 & 1) == 0) {
              poVar5 = std::operator<<((ostream *)&std::cerr,"Could not create entry ");
              poVar5 = std::operator<<(poVar5,(string *)fullpath.field_2._8_8_);
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              outPath.field_2._12_4_ = 3;
            }
            else {
              pOVar7 = option::Option::operator_cast_to_Option_
                                 ((Option *)(path.field_2._8_8_ + 0x150));
              if (pOVar7 == (Option *)0x0) {
                local_369 = ZAP::Archive::getData
                                      ((Archive *)local_a0,(Entry *)fullpath.field_2._8_8_,
                                       (char **)&size,(size_t *)&stack0xfffffffffffffc98);
              }
              else {
                local_369 = ZAP::Archive::getRawData
                                      ((Archive *)local_a0,(Entry *)fullpath.field_2._8_8_,
                                       (char **)&size,(size_t *)&stack0xfffffffffffffc98);
              }
              if (local_369 == false) {
                poVar5 = std::operator<<((ostream *)&std::cerr,"Could not extract entry ");
                poVar5 = std::operator<<(poVar5,(string *)fullpath.field_2._8_8_);
                std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                outPath.field_2._12_4_ = 3;
              }
              else {
                std::ostream::write(local_348,size);
                if (size != 0) {
                  operator_delete__((void *)size);
                }
                outPath.field_2._12_4_ = 0;
              }
            }
            std::fstream::~fstream(&data);
          }
          else {
            poVar5 = std::operator<<((ostream *)&std::cerr,"Could not create path ");
            poVar5 = std::operator<<(poVar5,(string *)local_128);
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            outPath.field_2._12_4_ = 3;
          }
          std::__cxx11::string::~string((string *)local_128);
          __gnu_cxx::
          __normal_iterator<const_ZAP::Archive::Entry_**,_std::vector<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>_>
          ::operator++(&__end2);
        }
        std::vector<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>::
        ~vector((vector<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_> *
                )&__range2);
        outPath.field_2._12_4_ = 0;
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Output is not a directory");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        parse_local._4_4_ = 1;
        outPath.field_2._12_4_ = 1;
      }
      std::__cxx11::string::~string((string *)local_c8);
      if (outPath.field_2._12_4_ != 0) goto LAB_001082d6;
    }
    else {
      print((Archive *)local_a0);
    }
    parse_local._4_4_ = 0;
    outPath.field_2._12_4_ = 1;
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Could not open archive");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    parse_local._4_4_ = 1;
    outPath.field_2._12_4_ = 1;
  }
LAB_001082d6:
  ZAP::Archive::~Archive((Archive *)local_a0);
  std::__cxx11::string::~string((string *)local_40);
  return parse_local._4_4_;
}

Assistant:

int extract(option::Parser &parse, option::Option *options)
	{
		if (parse.nonOptionsCount() < 1)
		{
			std::cerr << "Filename required" << std::endl;
			return 1;
		}
		std::string path = parse.nonOption(0);

		ZAP::Archive archive;
		if (!archive.openFile(path))
		{
			std::cerr << "Could not open archive" << std::endl;
			return 1;
		}

		if (options[LIST])
		{
			print(archive);
		}
		else
		{
			std::string outPath = ".";
			if (parse.nonOptionsCount() >= 2)
			{
				outPath = parse.nonOption(1);
			}
			if (!isDirectory(outPath))
			{
				std::cerr << "Output is not a directory" << std::endl;
				return 1;
			}

			ZAP::Archive::EntryList list;
			archive.getFileList(list);

			for (const ZAP::Archive::Entry *entry : list)
			{
				std::string fullpath = (outPath + '/' + entry->virtual_path);
				cleanPath(fullpath);
				if (!createPath(fullpath))
				{
					std::cerr << "Could not create path " << fullpath << std::endl;
					continue;
				}

				std::fstream stream(fullpath.c_str(), std::ios::out | std::ios::binary | std::ios::trunc);
				if (!stream.is_open())
				{
					std::cerr << "Could not create entry " << entry->virtual_path << std::endl;
					continue;
				}

				char *data;
				size_t size;

				bool extractSuccess = false;
				if (options[RAW])
					extractSuccess = archive.getRawData(entry, data, size);
				else
					extractSuccess = archive.getData(entry, data, size);

				if (!extractSuccess)
				{
					std::cerr << "Could not extract entry " << entry->virtual_path << std::endl;
					continue;
				}

				stream.write(data, size);

				delete[] data;
			}
		}

		return 0;
	}